

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cutPre22.c
# Opt level: O3

void Cut_CellTruthElem(uint *InA,uint *InB,uint *InC,uint *pOut,int nVars,int Type)

{
  long lVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  
  if (0x15 < nVars) {
    __assert_fail("Type < 22",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/cut/cutPre22.c"
                  ,0x283,
                  "void Cut_CellTruthElem(unsigned int *, unsigned int *, unsigned int *, unsigned int *, int, int)"
                 );
  }
  switch(nVars) {
  case 0:
    uVar2 = 0;
    uVar3 = 0;
    uVar4 = 0;
    uVar5 = 0;
    goto LAB_00456871;
  case 1:
    uVar5 = 0xffffffff;
    uVar2 = 0xffffffff;
    uVar3 = 0xffffffff;
    uVar4 = 0xffffffff;
LAB_00456871:
    pOut[0xc] = uVar2;
    pOut[0xd] = uVar3;
    pOut[0xe] = uVar4;
    pOut[0xf] = uVar5;
    pOut[8] = uVar2;
    pOut[9] = uVar3;
    pOut[10] = uVar4;
    pOut[0xb] = uVar5;
    pOut[4] = uVar2;
    pOut[5] = uVar3;
    pOut[6] = uVar4;
    pOut[7] = uVar5;
    *pOut = uVar2;
    pOut[1] = uVar3;
    pOut[2] = uVar4;
    pOut[3] = uVar5;
    return;
  case 2:
    lVar1 = 0;
    do {
      pOut[lVar1] = InA[lVar1];
      lVar1 = lVar1 + 1;
    } while (lVar1 != 0x10);
    break;
  case 3:
    lVar1 = 0;
    do {
      pOut[lVar1] = InB[lVar1] & InA[lVar1];
      lVar1 = lVar1 + 1;
    } while (lVar1 != 0x10);
    break;
  case 4:
    lVar1 = 0;
    do {
      pOut[lVar1] = ~(InB[lVar1] & InA[lVar1]);
      lVar1 = lVar1 + 1;
    } while (lVar1 != 0x10);
    break;
  case 5:
    lVar1 = 0;
    do {
      pOut[lVar1] = InB[lVar1] ^ InA[lVar1];
      lVar1 = lVar1 + 1;
    } while (lVar1 != 0x10);
    break;
  case 6:
    lVar1 = 0;
    do {
      pOut[lVar1] = InB[lVar1] & InA[lVar1] & InC[lVar1];
      lVar1 = lVar1 + 1;
    } while (lVar1 != 0x10);
    break;
  case 7:
    lVar1 = 0;
    do {
      pOut[lVar1] = ~(InB[lVar1] & InA[lVar1] & InC[lVar1]);
      lVar1 = lVar1 + 1;
    } while (lVar1 != 0x10);
    break;
  case 8:
    lVar1 = 0;
    do {
      pOut[lVar1] = (InC[lVar1] | InB[lVar1]) & InA[lVar1];
      lVar1 = lVar1 + 1;
    } while (lVar1 != 0x10);
    break;
  case 9:
    lVar1 = 0;
    do {
      pOut[lVar1] = ~((InC[lVar1] | InB[lVar1]) & InA[lVar1]);
      lVar1 = lVar1 + 1;
    } while (lVar1 != 0x10);
    break;
  case 10:
    lVar1 = 0;
    do {
      pOut[lVar1] = InB[lVar1] ^ InA[lVar1] ^ InC[lVar1];
      lVar1 = lVar1 + 1;
    } while (lVar1 != 0x10);
    break;
  case 0xb:
    lVar1 = 0;
    do {
      pOut[lVar1] = InC[lVar1] & InB[lVar1] ^ InA[lVar1];
      lVar1 = lVar1 + 1;
    } while (lVar1 != 0x10);
    break;
  case 0xc:
    lVar1 = 0;
    do {
      pOut[lVar1] = (InC[lVar1] ^ InB[lVar1]) & InA[lVar1];
      lVar1 = lVar1 + 1;
    } while (lVar1 != 0x10);
    break;
  case 0xd:
    lVar1 = 0;
    do {
      pOut[lVar1] = ~((InC[lVar1] ^ InB[lVar1]) & InA[lVar1]);
      lVar1 = lVar1 + 1;
    } while (lVar1 != 0x10);
    break;
  case 0xe:
    lVar1 = 0;
    do {
      pOut[lVar1] = InC[lVar1] & InA[lVar1] | (InC[lVar1] | InA[lVar1]) & InB[lVar1];
      lVar1 = lVar1 + 1;
    } while (lVar1 != 0x10);
    break;
  case 0xf:
    lVar1 = 0;
    do {
      pOut[lVar1] = ~(InB[lVar1] | InA[lVar1] | InC[lVar1]) | InB[lVar1] & InA[lVar1] & InC[lVar1];
      lVar1 = lVar1 + 1;
    } while (lVar1 != 0x10);
    break;
  case 0x10:
    lVar1 = 0;
    do {
      pOut[lVar1] = (InB[lVar1] | InA[lVar1] | InC[lVar1]) ^ InB[lVar1] & InA[lVar1] & InC[lVar1];
      lVar1 = lVar1 + 1;
    } while (lVar1 != 0x10);
    break;
  case 0x11:
    lVar1 = 0;
    do {
      pOut[lVar1] = ~InA[lVar1] & InC[lVar1] | (InC[lVar1] | InA[lVar1]) & InB[lVar1];
      lVar1 = lVar1 + 1;
    } while (lVar1 != 0x10);
    break;
  case 0x12:
    lVar1 = 0;
    do {
      pOut[lVar1] = InA[lVar1] & InB[lVar1] & ~InC[lVar1] | (InB[lVar1] ^ InA[lVar1]) & InC[lVar1];
      lVar1 = lVar1 + 1;
    } while (lVar1 != 0x10);
    break;
  case 0x13:
    lVar1 = 0;
    do {
      pOut[lVar1] = ~(InA[lVar1] & InB[lVar1] & ~InC[lVar1] | (InB[lVar1] ^ InA[lVar1]) & InC[lVar1]
                     );
      lVar1 = lVar1 + 1;
    } while (lVar1 != 0x10);
    break;
  case 0x14:
    lVar1 = 0;
    do {
      pOut[lVar1] = InC[lVar1] & InB[lVar1] | ~(InC[lVar1] | InB[lVar1]) & InA[lVar1];
      lVar1 = lVar1 + 1;
    } while (lVar1 != 0x10);
    break;
  case 0x15:
    lVar1 = 0;
    do {
      pOut[lVar1] = ~(InC[lVar1] & InB[lVar1] | ~(InC[lVar1] | InB[lVar1]) & InA[lVar1]);
      lVar1 = lVar1 + 1;
    } while (lVar1 != 0x10);
  }
  return;
}

Assistant:

void Cut_CellTruthElem( unsigned * InA, unsigned * InB, unsigned * InC, unsigned * pOut, int nVars, int Type )
{
    int nWords = Extra_TruthWordNum( nVars );
    int i;

    assert( Type < 22 );
    switch ( Type )
    {
    // " 0\n",                         // 00   const 0
    case 0:
        for ( i = 0; i < nWords; i++ )
            pOut[i] = 0;
        return;
    // " 1\n",                         // 01   const 1
    case 1:
        for ( i = 0; i < nWords; i++ )
            pOut[i] = 0xFFFFFFFF;
        return;
    // "1 1\n",                        // 02   a
    case 2:
        for ( i = 0; i < nWords; i++ )
            pOut[i] = InA[i];
        return;
    // "11 1\n",                       // 03   ab
    case 3:
        for ( i = 0; i < nWords; i++ )
            pOut[i] = InA[i] & InB[i];
        return;
    // "11 0\n",                       // 04   (ab)'
    case 4:
        for ( i = 0; i < nWords; i++ )
            pOut[i] = ~(InA[i] & InB[i]);
        return;
    // "10 1\n01 1\n",                 // 05   a<+>b
    case 5:
        for ( i = 0; i < nWords; i++ )
            pOut[i] = InA[i] ^ InB[i];
        return;
    // "111 1\n",                      // 06 + abc
    case 6:
        for ( i = 0; i < nWords; i++ )
            pOut[i] = InA[i] & InB[i] & InC[i];
        return;
    // "111 0\n",                      // 07   (abc)'
    case 7:
        for ( i = 0; i < nWords; i++ )
            pOut[i] = ~(InA[i] & InB[i] & InC[i]);
        return;
    // "11- 1\n1-1 1\n",               // 08 + a(b+c)
    case 8:
        for ( i = 0; i < nWords; i++ )
            pOut[i] = InA[i] & (InB[i] | InC[i]);
        return;
    // "11- 0\n1-1 0\n",               // 09   (a(b+c))'
    case 9:
        for ( i = 0; i < nWords; i++ )
            pOut[i] = ~(InA[i] & (InB[i] | InC[i]));
        return;
    // "111 1\n100 1\n010 1\n001 1\n", // 10 + a<+>b<+>c
    case 10:
        for ( i = 0; i < nWords; i++ )
            pOut[i] = InA[i] ^ InB[i] ^ InC[i];
        return;
    // "10- 0\n1-0 0\n011 0\n",        // 11 + a<+>bc
    case 11:
        for ( i = 0; i < nWords; i++ )
            pOut[i] = InA[i] ^ (InB[i] & InC[i]);
        return;
    // "101 1\n110 1\n",               // 12 + a(b<+>c)
    case 12:
        for ( i = 0; i < nWords; i++ )
            pOut[i] = InA[i] & (InB[i] ^ InC[i]);
        return;
    // "101 0\n110 0\n",               // 13   (a(b<+>c))'
    case 13:
        for ( i = 0; i < nWords; i++ )
            pOut[i] = ~(InA[i] & (InB[i] ^ InC[i]));
        return;
    // "11- 1\n1-1 1\n-11 1\n",        // 14 + ab+bc+ac
    case 14:
        for ( i = 0; i < nWords; i++ )
            pOut[i] = (InA[i] & InB[i]) | (InB[i] & InC[i]) | (InA[i] & InC[i]);
        return;
    // "111 1\n000 1\n",               // 15 + abc+a'b'c'
    case 15:
        for ( i = 0; i < nWords; i++ )
            pOut[i] = (InA[i] & InB[i] & InC[i]) | (~InA[i] & ~InB[i] & ~InC[i]);
        return;
    // "111 0\n000 0\n",               // 16   (abc+a'b'c')'
    case 16:
        for ( i = 0; i < nWords; i++ )
            pOut[i] = ~((InA[i] & InB[i] & InC[i]) | (~InA[i] & ~InB[i] & ~InC[i]));
        return;
    // "11- 1\n-11 1\n0-1 1\n",        // 17 + ab+bc+a'c
    case 17:
        for ( i = 0; i < nWords; i++ )
            pOut[i] = (InA[i] & InB[i]) | (InB[i] & InC[i]) | (~InA[i] & InC[i]);
        return;
    // "011 1\n101 1\n110 1\n",        // 18 + a'bc+ab'c+abc'
    case 18:
        for ( i = 0; i < nWords; i++ )
            pOut[i] = (~InA[i] & InB[i] & InC[i]) | (InA[i] & ~InB[i] & InC[i]) | (InA[i] & InB[i] & ~InC[i]);
        return;
    // "011 0\n101 0\n110 0\n",        // 19   (a'bc+ab'c+abc')'
    case 19:
        for ( i = 0; i < nWords; i++ )
            pOut[i] = ~((~InA[i] & InB[i] & InC[i]) | (InA[i] & ~InB[i] & InC[i]) | (InA[i] & InB[i] & ~InC[i]));
        return;
    // "100 1\n-11 1\n",               // 20 + ab'c'+bc
    case 20:
        for ( i = 0; i < nWords; i++ )
            pOut[i] = (InA[i] & ~InB[i] & ~InC[i]) | (InB[i] & InC[i]);
        return;
    // "100 0\n-11 0\n"                // 21   (ab'c'+bc)'
    case 21:
        for ( i = 0; i < nWords; i++ )
            pOut[i] = ~((InA[i] & ~InB[i] & ~InC[i]) | (InB[i] & InC[i]));
        return;
    }
}